

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckNameOfClass.cxx
# Opt level: O1

size_t __thiscall kws::Parser::GetClassPosition(Parser *this,size_t position,string *buffer)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  string nameOfClass;
  ulong local_80;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar3 = 0;
  if (position != 0xffffffffffffffff) {
    uVar3 = position;
  }
  if (buffer->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)buffer);
  }
  uVar3 = std::__cxx11::string::find((char *)buffer,0x178926,uVar3);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  if (uVar3 != 0xffffffffffffffff) {
    do {
      pcVar1 = (buffer->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + buffer->_M_string_length);
      bVar2 = IsBetweenCharsFast(this,'<','>',uVar3,false,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (!bVar2) {
        bVar2 = true;
        if (((1 < uVar3) && (cVar6 = (buffer->_M_dataplus)._M_p[uVar3 - 1], cVar6 != ' ')) &&
           (cVar6 != '/')) {
          bVar2 = cVar6 == '\n';
        }
        if (((uVar3 < buffer->_M_string_length - 2) &&
            (cVar6 = (buffer->_M_dataplus)._M_p[uVar3 + 5], cVar6 != ' ')) &&
           ((cVar6 != '/' && (cVar6 != '\r')))) {
          bVar2 = false;
        }
        uVar7 = uVar3 + 4;
        uVar4 = std::__cxx11::string::find((char)buffer,0x7b);
        uVar5 = std::__cxx11::string::find((char)buffer,0x3b);
        local_80 = uVar7;
        if (uVar4 < uVar5) {
          pcVar1 = (buffer->_M_dataplus)._M_p;
          cVar6 = pcVar1[uVar7];
          if (cVar6 != '{') {
            uVar4 = buffer->_M_string_length;
            uVar5 = uVar7;
            if (uVar7 < uVar4) {
              uVar5 = uVar4;
            }
            do {
              local_80 = uVar5;
              if ((uVar4 <= uVar7) || (local_80 = uVar7, cVar6 == ':')) break;
              if (cVar6 == ';') {
                bVar2 = false;
                break;
              }
              cVar6 = pcVar1[uVar7 + 1];
              uVar7 = uVar7 + 1;
              local_80 = uVar7;
            } while (cVar6 != '{');
          }
        }
        else {
          bVar2 = false;
        }
        if (bVar2) goto LAB_00155969;
      }
      uVar3 = std::__cxx11::string::find((char *)buffer,0x178926,uVar3 + 1);
    } while (uVar3 != 0xffffffffffffffff);
  }
  local_80 = 0xffffffffffffffff;
LAB_00155969:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return local_80;
}

Assistant:

size_t Parser::GetClassPosition(size_t position,std::string buffer) const
{
  if(position == std::string::npos)
   {
   position = 0;
   }

   if (buffer.empty()) {
     buffer = m_BufferNoComment;
   }

  size_t pos = buffer.find("class",position);

  std::string nameOfClass = "";
  while(pos!=std::string::npos)
    {
    if(!this->IsBetweenCharsFast('<','>',pos,false,buffer))
      {
      bool valid = true;      
      // We check that the word class is alone
      if(pos>1)
        {
        if(buffer[pos-1] != ' ' && buffer[pos-1] != '/' && buffer[pos-1] != '\n')
          {
          valid = false;
          }
        }
      if(pos<buffer.size()-2)
        {
        if(buffer[pos+5] != ' ' && buffer[pos+5] != '/' && buffer[pos+5] != '\r')
          {
          valid = false;
          } 
        }
      
      size_t i = pos+4;
      // We should get a { before a ;
      size_t brac = buffer.find('{',pos);
      size_t sem = buffer.find(';',pos);

      if(sem<=brac)
        {
        valid = false;
        }
      else
        {
        while((buffer[i] != '{')
          && (i<buffer.size())
          )
          {
          if(buffer[i] == ';')
            {
            valid = false;
            break;
            }
          else if(buffer[i] == ':')
            {
            break;
            }
          i++;
          }
        }
      
      if(valid)
        {
        return i;
        }
      }
    pos = buffer.find("class",pos+1);
    }

  return std::string::npos;
}